

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_analysis.cpp
# Opt level: O0

loop_variable * __thiscall
loop_variable_state::get_or_insert(loop_variable_state *this,ir_variable *var,bool in_assignee)

{
  loop_variable *local_28;
  loop_variable *lv;
  bool in_assignee_local;
  ir_variable *var_local;
  loop_variable_state *this_local;
  
  local_28 = get(this,var);
  if (local_28 == (loop_variable *)0x0) {
    local_28 = insert(this,var);
    local_28->read_before_write = (bool)((in_assignee ^ 0xffU) & 1);
  }
  return local_28;
}

Assistant:

loop_variable *
loop_variable_state::get_or_insert(ir_variable *var, bool in_assignee)
{
   loop_variable *lv = this->get(var);

   if (lv == NULL) {
      lv = this->insert(var);
      lv->read_before_write = !in_assignee;
   }

   return lv;
}